

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O3

Var Js::JavascriptOperators::OP_LdFuncObjProto(Var funcObj,ScriptContext *scriptContext)

{
  bool bVar1;
  ThreadContext *pTVar2;
  bool bVar3;
  RecyclableObject *pRVar4;
  
  pTVar2 = scriptContext->threadContext;
  bVar1 = pTVar2->noJsReentrancy;
  pTVar2->noJsReentrancy = true;
  pRVar4 = VarTo<Js::RecyclableObject>(funcObj);
  pRVar4 = RecyclableObject::GetPrototype(pRVar4);
  if (pRVar4 != (RecyclableObject *)0x0) {
    bVar3 = IsConstructor(pRVar4);
    if (bVar3) {
      pTVar2->noJsReentrancy = bVar1;
      return pRVar4;
    }
  }
  JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ec00,(PCWSTR)0x0);
}

Assistant:

Var JavascriptOperators::OP_LdFuncObjProto(Var funcObj, ScriptContext* scriptContext)
    {
        JIT_HELPER_NOT_REENTRANT_HEADER(LdFuncObjProto, reentrancylock, scriptContext->GetThreadContext());
        RecyclableObject *superCtor = VarTo<RecyclableObject>(funcObj)->GetPrototype();

        if (superCtor == nullptr || !IsConstructor(superCtor))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_NotAConstructor);
        }

        return superCtor;
        JIT_HELPER_END(LdFuncObjProto);
    }